

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::FragOpInteractionCase::iterate(FragOpInteractionCase *this)

{
  allocator<deqp::gls::(anonymous_namespace)::RenderCommand> *this_00;
  ShaderInput *this_01;
  Context *ctx_00;
  bool bVar1;
  deUint32 dVar2;
  int ndx_00;
  uint uVar3;
  int iVar4;
  uint uVar5;
  TestLog *pTVar6;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar7;
  int *piVar8;
  size_type sVar9;
  reference ppSVar10;
  Variable *pVVar11;
  reference command;
  reference pvVar12;
  undefined4 extraout_var;
  PixelFormat *pPVar13;
  pointer pVVar14;
  char *pcVar15;
  reference cmd;
  uint *puVar16;
  void *pvVar17;
  undefined4 extraout_var_00;
  Scalar *pSVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ConstValueAccess CVar23;
  ConstValueAccess value;
  ConstPixelBufferAccess local_4c0;
  ConstPixelBufferAccess local_498;
  undefined1 local_46d;
  RGBA local_46c;
  RGBA RStack_468;
  bool compareOk;
  RGBA local_464;
  iterator iStack_460;
  RGBA threshold;
  __normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
  local_458;
  __normal_iterator<const_deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
  local_450;
  const_iterator cmdIter_1;
  __normal_iterator<rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_438;
  __normal_iterator<rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_430;
  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_428;
  const_iterator uniformIter;
  deUint32 program;
  Context *ctx;
  undefined1 local_408 [4];
  int ndx;
  Vec4 clearColor;
  Vec4 accurateClearColor;
  PixelBufferAccess readDst [2];
  deUint32 local_390 [2];
  deUint32 programs [2];
  Context *contexts [2];
  undefined1 auStack_328 [8];
  VertexArrayPointer posPtr;
  int local_2fc;
  ContextType local_2f8;
  int cmdNdx;
  __normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
  local_2f0;
  __normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
  local_2e8;
  iterator cmdIter;
  Vector<float,_4> local_2d0;
  undefined1 local_2c0 [12];
  Vector<float,_3> local_2b4;
  undefined1 local_2a8 [8];
  Vector<float,_2> local_2a0;
  undefined1 local_298 [4];
  Vector<float,_1> local_294;
  undefined1 *local_290;
  Vec4 *f;
  int fNdx;
  int vtxNdx;
  VertexArrayBinding layoutEntry;
  undefined1 local_228 [4];
  int numComponents;
  ConstValueRangeAccess valueRange;
  VariableType *varType;
  ShaderInput *shaderIn;
  undefined1 local_1f8 [4];
  int attribNdx;
  Vec4 vtxInterpFactors [4];
  undefined1 local_1b0 [8];
  Surface reference;
  Surface rendered;
  undefined1 local_178 [8];
  vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
  renderCmds;
  vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> uniformValues;
  VertexDataStorage vertexData;
  int numVertices;
  int positionNdx;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ScopedLogSection local_30;
  ScopedLogSection section;
  Random rnd;
  FragOpInteractionCase *this_local;
  
  uVar5 = (this->m_params).seed;
  dVar2 = ::deInt32Hash(this->m_iterNdx);
  de::Random::Random((Random *)&section,uVar5 ^ dVar2);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Iter",&local_81);
  de::toString<int>(&local_a8,&this->m_iterNdx);
  std::operator+(&local_60,&local_80,&local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Iteration ",&local_e9);
  de::toString<int>((string *)&numVertices,&this->m_iterNdx);
  std::operator+(&local_c8,&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numVertices);
  tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar6,&local_60,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&numVertices);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pvVar7 = rsg::Shader::getInputs(&this->m_vertexShader);
  ndx_00 = gls::anon_unknown_0::findShaderInputIndex(pvVar7,"dEQP_Position");
  pvVar7 = rsg::Shader::getInputs(&this->m_vertexShader);
  gls::anon_unknown_0::VertexDataStorage::VertexDataStorage
            ((VertexDataStorage *)
             &uniformValues.
              super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar7,4);
  std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::vector
            ((vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)
             &renderCmds.
              super__Vector_base<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (allocator<deqp::gls::(anonymous_namespace)::RenderCommand> *)
            ((long)&rendered.m_pixels.m_cap + 7);
  std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>::allocator(this_00);
  std::
  vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
  ::vector((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
            *)local_178,5,this_00);
  std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>::~allocator
            ((allocator<deqp::gls::(anonymous_namespace)::RenderCommand> *)
             ((long)&rendered.m_pixels.m_cap + 7));
  piVar8 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  iVar4 = *piVar8;
  piVar8 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
  tcu::Surface::Surface((Surface *)&reference.m_pixels.m_cap,iVar4,*piVar8);
  piVar8 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
  iVar4 = *piVar8;
  piVar8 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
  tcu::Surface::Surface((Surface *)local_1b0,iVar4,*piVar8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1f8,0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vtxInterpFactors[0].m_data + 2),1.0,0.0,0.5,0.5);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vtxInterpFactors[1].m_data + 2),0.0,1.0,0.5,0.5);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vtxInterpFactors[2].m_data + 2),1.0,1.0,1.0,0.0);
  rsg::computeUniformValues
            ((Random *)&section,
             (vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)
             &renderCmds.
              super__Vector_base<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_unifiedUniforms);
  shaderIn._4_4_ = 0;
  while( true ) {
    pvVar7 = rsg::Shader::getInputs(&this->m_vertexShader);
    sVar9 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::size(pvVar7);
    if ((int)sVar9 <= shaderIn._4_4_) break;
    if (shaderIn._4_4_ != ndx_00) {
      pvVar7 = rsg::Shader::getInputs(&this->m_vertexShader);
      ppSVar10 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::operator[]
                           (pvVar7,(long)shaderIn._4_4_);
      this_01 = *ppSVar10;
      pVVar11 = rsg::ShaderInput::getVariable(this_01);
      valueRange.m_max = (Scalar *)rsg::Variable::getType(pVVar11);
      rsg::ShaderInput::getValueRange((ConstValueRangeAccess *)local_228,this_01);
      layoutEntry.pointer.data._4_4_ =
           rsg::VariableType::getNumElements((VariableType *)valueRange.m_max);
      gls::anon_unknown_0::getEntryWithPointer
                ((VertexArrayBinding *)&fNdx,
                 (VertexDataStorage *)
                 &uniformValues.
                  super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,shaderIn._4_4_);
      for (f._4_4_ = 0; iVar4 = f._4_4_, f._4_4_ < 4; f._4_4_ = f._4_4_ + 1) {
        uVar3 = shaderIn._4_4_ + f._4_4_ + this->m_iterNdx;
        uVar5 = uVar3;
        if ((int)uVar3 < 0) {
          uVar5 = this->m_iterNdx + 3 + shaderIn._4_4_ + f._4_4_;
        }
        f._0_4_ = uVar3 - (uVar5 & 0xfffffffc);
        local_290 = local_1f8 + (long)(int)f * 0x10;
        switch(layoutEntry.pointer.data._4_4_) {
        case 1:
          tcu::Vector<float,_4>::toWidth<1>((Vector<float,_4> *)local_298);
          gls::anon_unknown_0::interpolateRange<1>
                    ((anon_unknown_0 *)&local_294,(ConstValueRangeAccess *)local_228,
                     (Vector<float,_1> *)local_298);
          gls::anon_unknown_0::setVertex<1>
                    ((VertexArrayPointer *)&layoutEntry.binding.location,iVar4,&local_294);
          break;
        case 2:
          tcu::Vector<float,_4>::toWidth<2>((Vector<float,_4> *)local_2a8);
          gls::anon_unknown_0::interpolateRange<2>
                    ((anon_unknown_0 *)&local_2a0,(ConstValueRangeAccess *)local_228,
                     (Vector<float,_2> *)local_2a8);
          gls::anon_unknown_0::setVertex<2>
                    ((VertexArrayPointer *)&layoutEntry.binding.location,iVar4,&local_2a0);
          break;
        case 3:
          tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)local_2c0);
          gls::anon_unknown_0::interpolateRange<3>
                    ((anon_unknown_0 *)&local_2b4,(ConstValueRangeAccess *)local_228,
                     (Vector<float,_3> *)local_2c0);
          gls::anon_unknown_0::setVertex<3>
                    ((VertexArrayPointer *)&layoutEntry.binding.location,iVar4,&local_2b4);
          break;
        case 4:
          tcu::Vector<float,_4>::toWidth<4>((Vector<float,_4> *)&cmdIter);
          gls::anon_unknown_0::interpolateRange<4>
                    ((anon_unknown_0 *)&local_2d0,(ConstValueRangeAccess *)local_228,
                     (Vector<float,_4> *)&cmdIter);
          gls::anon_unknown_0::setVertex<4>
                    ((VertexArrayPointer *)&layoutEntry.binding.location,iVar4,&local_2d0);
        }
      }
      glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)&fNdx);
    }
    shaderIn._4_4_ = shaderIn._4_4_ + 1;
  }
  local_2e8._M_current =
       (RenderCommand *)
       std::
       vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
       ::begin((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                *)local_178);
  while( true ) {
    local_2f0._M_current =
         (RenderCommand *)
         std::
         vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
         ::end((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                *)local_178);
    bVar1 = __gnu_cxx::operator!=(&local_2e8,&local_2f0);
    if (!bVar1) break;
    command = __gnu_cxx::
              __normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
              ::operator*(&local_2e8);
    local_2f8.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    cmdNdx = (int)glu::ContextType::getAPI(&local_2f8);
    piVar8 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
    iVar4 = *piVar8;
    piVar8 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
    gls::anon_unknown_0::computeRandomRenderCommand
              ((Random *)&section,command,(ApiType)cmdNdx,iVar4,*piVar8);
    __gnu_cxx::
    __normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
    ::operator++(&local_2e8);
  }
  for (local_2fc = 0;
      sVar9 = std::
              vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
              ::size((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                      *)local_178), local_2fc < (int)sVar9; local_2fc = local_2fc + 1) {
    pvVar12 = std::
              vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
              ::operator[]((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                            *)local_178,(long)local_2fc);
    pvVar12->depth = (float)local_2fc * 0.0231725 + pvVar12->depth;
  }
  gls::anon_unknown_0::getEntryWithPointer
            ((VertexArrayBinding *)(contexts + 1),
             (VertexDataStorage *)
             &uniformValues.
              super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,ndx_00);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)(contexts + 1));
  programs = (deUint32  [2])this->m_glCtx;
  contexts[0] = &(this->m_referenceCtx->context).super_Context;
  local_390[0] = this->m_glProgram;
  local_390[1] = this->m_refProgram;
  tcu::Surface::getAccess
            ((PixelBufferAccess *)(accurateClearColor.m_data + 2),
             (Surface *)&reference.m_pixels.m_cap);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&readDst[0].super_ConstPixelBufferAccess.m_data,
             (Surface *)local_1b0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(clearColor.m_data + 2),0.0,0.25,0.5,1.0);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar13 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar4));
  gls::anon_unknown_0::getWellBehavingColor
            ((anon_unknown_0 *)local_408,(Vec4 *)(clearColor.m_data + 2),pPVar13);
  for (ctx._4_4_ = 0; ctx._4_4_ < 2; ctx._4_4_ = ctx._4_4_ + 1) {
    ctx_00 = contexts[(long)ctx._4_4_ + -1];
    uniformIter._M_current._4_4_ = local_390[ctx._4_4_];
    gls::anon_unknown_0::setupAttributes
              (ctx_00,(VertexDataStorage *)
                      &uniformValues.
                       super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
               uniformIter._M_current._4_4_);
    (*ctx_00->_vptr_Context[0x34])(ctx_00,0xc11);
    pSVar18 = (Scalar *)&DAT_00000001;
    (*ctx_00->_vptr_Context[0x44])(ctx_00,1,1,1);
    (*ctx_00->_vptr_Context[0x45])(ctx_00,1);
    (*ctx_00->_vptr_Context[0x46])(ctx_00,0xffffffff);
    fVar19 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_408);
    fVar20 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_408);
    fVar21 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_408);
    fVar22 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_408);
    (*ctx_00->_vptr_Context[0x2a])(fVar19,fVar20,fVar21,fVar22);
    (*ctx_00->_vptr_Context[0x2d])(ctx_00,0x4500);
    (*ctx_00->_vptr_Context[0x76])(ctx_00,(ulong)uniformIter._M_current._4_4_);
    local_430._M_current =
         (VariableValue *)
         std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::begin
                   ((vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)
                    &renderCmds.
                     super__Vector_base<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<rsg::VariableValue_const*,std::vector<rsg::VariableValue,std::allocator<rsg::VariableValue>>>
    ::__normal_iterator<rsg::VariableValue*>
              ((__normal_iterator<rsg::VariableValue_const*,std::vector<rsg::VariableValue,std::allocator<rsg::VariableValue>>>
                *)&local_428,&local_430);
    while( true ) {
      local_438._M_current =
           (VariableValue *)
           std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::end
                     ((vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)
                      &renderCmds.
                       super__Vector_base<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_428,&local_438);
      uVar5 = uniformIter._M_current._4_4_;
      if (!bVar1) break;
      pVVar14 = __gnu_cxx::
                __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                ::operator->(&local_428);
      pVVar11 = rsg::VariableValue::getVariable(pVVar14);
      pcVar15 = rsg::Variable::getName(pVVar11);
      uVar5 = (*ctx_00->_vptr_Context[0x66])(ctx_00,(ulong)uVar5,pcVar15);
      pVVar14 = __gnu_cxx::
                __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
                ::operator->(&local_428);
      CVar23 = rsg::VariableValue::getValue(pVVar14);
      cmdIter_1._M_current = (RenderCommand *)CVar23.m_type;
      value.m_value = pSVar18;
      value.m_type = (VariableType *)CVar23.m_value;
      gls::anon_unknown_0::setUniformValue
                ((anon_unknown_0 *)ctx_00,(Context *)(ulong)uVar5,(int)CVar23.m_type,value);
      __gnu_cxx::
      __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
      ::operator++(&local_428);
    }
    local_458._M_current =
         (RenderCommand *)
         std::
         vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
         ::begin((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                  *)local_178);
    __gnu_cxx::
    __normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand_const*,std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>>>
    ::__normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand*>
              ((__normal_iterator<deqp::gls::(anonymous_namespace)::RenderCommand_const*,std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>>>
                *)&local_450,&local_458);
    while( true ) {
      iStack_460 = std::
                   vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                   ::end((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
                          *)local_178);
      bVar1 = __gnu_cxx::operator!=(&local_450,&stack0xfffffffffffffba0);
      if (!bVar1) break;
      cmd = __gnu_cxx::
            __normal_iterator<const_deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
            ::operator*(&local_450);
      gls::anon_unknown_0::render(ctx_00,(VertexArrayPointer *)auStack_328,cmd);
      __gnu_cxx::
      __normal_iterator<const_deqp::gls::(anonymous_namespace)::RenderCommand_*,_std::vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>_>
      ::operator++(&local_450);
    }
    dVar2 = (*ctx_00->_vptr_Context[0x79])();
    glu::checkError(dVar2,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                    ,0x25c);
    puVar16 = (uint *)tcu::Vector<int,_2>::x(&this->m_viewportSize);
    uVar5 = *puVar16;
    puVar16 = (uint *)tcu::Vector<int,_2>::y(&this->m_viewportSize);
    uVar3 = *puVar16;
    pvVar17 = tcu::PixelBufferAccess::getDataPtr
                        ((PixelBufferAccess *)
                         &readDst[(long)ctx._4_4_ + -1].super_ConstPixelBufferAccess.m_data);
    (*ctx_00->_vptr_Context[0x78])(ctx_00,0,0,(ulong)uVar5,(ulong)uVar3,0x1908,0x1401,pvVar17);
  }
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar13 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_00,iVar4));
  RStack_468 = tcu::PixelFormat::getColorThreshold(pPVar13);
  tcu::RGBA::RGBA(&local_46c,3,3,3,3);
  local_464 = tcu::operator+(&stack0xfffffffffffffb98,&local_46c);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_498,(Surface *)local_1b0);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_4c0,(Surface *)&reference.m_pixels.m_cap);
  local_46d = tcu::bilinearCompare
                        (pTVar6,"CompareResult","Image comparison result",&local_498,&local_4c0,
                         local_464,COMPARE_LOG_RESULT);
  if ((bool)local_46d) {
    this->m_iterNdx = this->m_iterNdx + 1;
    this_local._4_4_ = (IterateResult)(this->m_iterNdx < 5);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
    this_local._4_4_ = STOP;
  }
  tcu::Surface::~Surface((Surface *)local_1b0);
  tcu::Surface::~Surface((Surface *)&reference.m_pixels.m_cap);
  std::
  vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
  ::~vector((vector<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
             *)local_178);
  std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::~vector
            ((vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)
             &renderCmds.
              super__Vector_base<deqp::gls::(anonymous_namespace)::RenderCommand,_std::allocator<deqp::gls::(anonymous_namespace)::RenderCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  gls::anon_unknown_0::VertexDataStorage::~VertexDataStorage
            ((VertexDataStorage *)
             &uniformValues.
              super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  de::Random::~Random((Random *)&section);
  return this_local._4_4_;
}

Assistant:

FragOpInteractionCase::IterateResult FragOpInteractionCase::iterate (void)
{
	de::Random							rnd					(m_params.seed ^ deInt32Hash(m_iterNdx));
	const tcu::ScopedLogSection			section				(m_testCtx.getLog(), string("Iter") + de::toString(m_iterNdx), string("Iteration ") + de::toString(m_iterNdx));

	const int							positionNdx			= findShaderInputIndex(m_vertexShader.getInputs(), "dEQP_Position");

	const int							numVertices			= 4;
	VertexDataStorage					vertexData			(m_vertexShader.getInputs(), numVertices);
	std::vector<rsg::VariableValue>		uniformValues;
	std::vector<RenderCommand>			renderCmds			(NUM_COMMANDS_PER_ITERATION);

	tcu::Surface						rendered			(m_viewportSize.x(), m_viewportSize.y());
	tcu::Surface						reference			(m_viewportSize.x(), m_viewportSize.y());

	const tcu::Vec4						vtxInterpFactors[]	=
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.5f, 0.5f),
		tcu::Vec4(0.0f, 1.0f, 0.5f, 0.5f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)
	};

	rsg::computeUniformValues(rnd, uniformValues, m_unifiedUniforms);

	for (int attribNdx = 0; attribNdx < (int)m_vertexShader.getInputs().size(); ++attribNdx)
	{
		if (attribNdx == positionNdx)
			continue;

		const rsg::ShaderInput*				shaderIn		= m_vertexShader.getInputs()[attribNdx];
		const rsg::VariableType&			varType			= shaderIn->getVariable()->getType();
		const rsg::ConstValueRangeAccess	valueRange		= shaderIn->getValueRange();
		const int							numComponents	= varType.getNumElements();
		const glu::VertexArrayBinding		layoutEntry		= getEntryWithPointer(vertexData, attribNdx);

		DE_ASSERT(varType.getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < 4; vtxNdx++)
		{
			const int			fNdx	= (attribNdx+vtxNdx+m_iterNdx)%DE_LENGTH_OF_ARRAY(vtxInterpFactors);
			const tcu::Vec4&	f		= vtxInterpFactors[fNdx];

			switch (numComponents)
			{
				case 1:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<1>()));	break;
				case 2:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<2>()));	break;
				case 3:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<3>()));	break;
				case 4:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<4>()));	break;
				default:
					DE_ASSERT(false);
			}
		}
	}

	for (vector<RenderCommand>::iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
		computeRandomRenderCommand(rnd, *cmdIter, m_renderCtx.getType().getAPI(), m_viewportSize.x(), m_viewportSize.y());

	// Workaround for inaccurate barycentric/depth computation in current reference renderer:
	// Small bias is added to the draw call depths, in increasing order, to avoid accuracy issues in depth comparison.
	for (int cmdNdx = 0; cmdNdx < (int)renderCmds.size(); cmdNdx++)
		renderCmds[cmdNdx].depth += 0.0231725f * float(cmdNdx);

	{
		const glu::VertexArrayPointer		posPtr				= getEntryWithPointer(vertexData, positionNdx).pointer;

		sglr::Context* const				contexts[]			= { m_glCtx, &m_referenceCtx->context };
		const deUint32						programs[]			= { m_glProgram, m_refProgram };
		tcu::PixelBufferAccess				readDst[]			= { rendered.getAccess(), reference.getAccess() };

		const tcu::Vec4						accurateClearColor	= tcu::Vec4(0.0f, 0.25f, 0.5f, 1.0f);
		const tcu::Vec4						clearColor			= getWellBehavingColor(accurateClearColor, m_renderCtx.getRenderTarget().getPixelFormat());

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(contexts); ndx++)
		{
			sglr::Context&	ctx			= *contexts[ndx];
			const deUint32	program		= programs[ndx];

			setupAttributes(ctx, vertexData, program);

			ctx.disable		(GL_SCISSOR_TEST);
			ctx.colorMask	(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			ctx.depthMask	(GL_TRUE);
			ctx.stencilMask	(~0u);
			ctx.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
			ctx.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

			ctx.useProgram	(program);

			for (vector<rsg::VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); ++uniformIter)
				setUniformValue(ctx, ctx.getUniformLocation(program, uniformIter->getVariable()->getName()), uniformIter->getValue());

			for (vector<RenderCommand>::const_iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
				render(ctx, posPtr, *cmdIter);

			GLU_EXPECT_NO_ERROR(ctx.getError(), "Rendering failed");

			ctx.readPixels(0, 0, m_viewportSize.x(), m_viewportSize.y(), GL_RGBA, GL_UNSIGNED_BYTE, readDst[ndx].getDataPtr());
		}
	}

	{
		const tcu::RGBA		threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold()+tcu::RGBA(3,3,3,3);
		const bool			compareOk		= tcu::bilinearCompare(m_testCtx.getLog(), "CompareResult", "Image comparison result", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (!compareOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			return STOP;
		}
	}

	m_iterNdx += 1;
	return (m_iterNdx < NUM_ITERATIONS) ? CONTINUE : STOP;
}